

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::JoinHashTable::ScanStructure::ScanInnerJoin
          (ScanStructure *this,DataChunk *keys,SelectionVector *result_vector)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  while( true ) {
    iVar3 = ResolvePredicates(this,keys,result_vector,(SelectionVector *)0x0);
    _Var1._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (bool *)0x0) {
      psVar2 = result_vector->sel_vector;
      for (iVar4 = 0; iVar3 != iVar4; iVar4 = iVar4 + 1) {
        iVar5 = iVar4;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar4];
        }
        _Var1._M_head_impl[iVar5] = true;
      }
    }
    if (iVar3 != 0) break;
    AdvancePointers(this);
    if (this->count == 0) {
      return 0;
    }
  }
  return iVar3;
}

Assistant:

idx_t ScanStructure::ScanInnerJoin(DataChunk &keys, SelectionVector &result_vector) {
	while (true) {
		// resolve the equality_predicates for this set of keys
		idx_t result_count = ResolvePredicates(keys, result_vector, nullptr);

		// after doing all the comparisons set the found_match vector
		if (found_match) {
			for (idx_t i = 0; i < result_count; i++) {
				auto idx = result_vector.get_index(i);
				found_match[idx] = true;
			}
		}
		if (result_count > 0) {
			return result_count;
		}
		// no matches found: check the next set of pointers
		AdvancePointers();
		if (this->count == 0) {
			return 0;
		}
	}
}